

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong *puVar5;
  
  uVar1 = bitC->bitPos;
  if (0x3f < uVar1) {
    __assert_fail("bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x606,"void BIT_flushBits(BIT_CStream_t *)");
  }
  puVar2 = (ulong *)bitC->ptr;
  puVar3 = (ulong *)bitC->endPtr;
  if (puVar2 <= puVar3) {
    puVar5 = (ulong *)((ulong)(uVar1 >> 3) + (long)puVar2);
    if (puVar3 < puVar5) {
      puVar5 = puVar3;
    }
    uVar4 = bitC->bitContainer;
    *puVar2 = uVar4;
    bitC->ptr = (char *)puVar5;
    bitC->bitPos = uVar1 & 7;
    bitC->bitContainer = uVar4 >> ((byte)uVar1 & 0x38);
    return;
  }
  __assert_fail("bitC->ptr <= bitC->endPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    assert(bitC->ptr <= bitC->endPtr);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}